

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_winograd.h
# Opt level: O3

void ncnn::pack_A_tile(Mat *A,Mat *AT,int batch,int max_ii,int max_kk)

{
  long lVar1;
  long lVar2;
  int iVar3;
  void *pvVar4;
  size_t sVar5;
  int iVar6;
  long lVar7;
  void **ppvVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  void **ppvVar13;
  ulong uVar14;
  ulong uVar15;
  undefined4 *puVar16;
  Mat *pMVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  long local_120;
  
  if (0 < batch) {
    iVar6 = max_kk * batch;
    pvVar4 = AT->data;
    iVar3 = AT->w;
    sVar5 = AT->elemsize;
    lVar11 = (long)iVar6;
    lVar18 = (long)max_ii;
    lVar1 = lVar11 * 4;
    lVar2 = (ulong)(uint)batch * 4;
    local_120 = 0;
    uVar9 = 0;
    pMVar17 = A;
    do {
      puVar16 = (undefined4 *)((long)iVar3 * sVar5 * uVar9 + (long)pvVar4);
      if (max_ii < 0x10) {
        uVar20 = 0;
      }
      else {
        lVar7 = local_120;
        uVar15 = 0;
        do {
          lVar12 = lVar7;
          iVar10 = max_kk;
          if (0 < max_kk) {
            do {
              *puVar16 = *(undefined4 *)((long)&A->data + lVar12);
              puVar16[1] = *(undefined4 *)((long)&A->data + lVar12 + lVar11 * 4);
              puVar16[2] = *(undefined4 *)((long)&A->data + lVar12 + (long)(iVar6 * 2) * 4);
              puVar16[3] = *(undefined4 *)((long)&A->data + lVar12 + (long)(iVar6 * 3) * 4);
              puVar16[4] = *(undefined4 *)((long)&A->data + lVar12 + (long)(iVar6 * 4) * 4);
              puVar16[5] = *(undefined4 *)((long)&A->data + lVar12 + (long)(iVar6 * 5) * 4);
              puVar16[6] = *(undefined4 *)((long)&A->data + lVar12 + (long)(iVar6 * 6) * 4);
              puVar16[7] = *(undefined4 *)((long)&A->data + lVar12 + (long)(iVar6 * 7) * 4);
              puVar16[8] = *(undefined4 *)((long)&A->data + lVar12 + (long)(iVar6 * 8) * 4);
              puVar16[9] = *(undefined4 *)((long)&A->data + lVar12 + (long)(iVar6 * 9) * 4);
              puVar16[10] = *(undefined4 *)((long)&A->data + lVar12 + (long)(iVar6 * 10) * 4);
              puVar16[0xb] = *(undefined4 *)((long)&A->data + lVar12 + (long)(iVar6 * 0xb) * 4);
              puVar16[0xc] = *(undefined4 *)((long)&A->data + lVar12 + (long)(iVar6 * 0xc) * 4);
              puVar16[0xd] = *(undefined4 *)((long)&A->data + lVar12 + (long)(iVar6 * 0xd) * 4);
              puVar16[0xe] = *(undefined4 *)((long)&A->data + lVar12 + (long)(iVar6 * 0xe) * 4);
              puVar16[0xf] = *(undefined4 *)((long)&A->data + lVar12 + (long)(iVar6 * 0xf) * 4);
              puVar16 = puVar16 + 0x10;
              iVar10 = iVar10 + -1;
              lVar12 = lVar12 + lVar2;
            } while (iVar10 != 0);
          }
          uVar20 = uVar15 + 0x10;
          lVar12 = uVar15 + 0x1f;
          lVar7 = lVar7 + lVar11 * 0x40;
          uVar15 = uVar20;
        } while (lVar12 < lVar18);
      }
      if ((int)((uint)uVar20 | 7) < max_ii) {
        uVar14 = uVar20 & 0xffffffff;
        lVar12 = lVar1 * uVar14;
        lVar7 = local_120;
        uVar15 = uVar14;
        do {
          lVar19 = lVar7;
          iVar10 = max_kk;
          if (0 < max_kk) {
            do {
              *puVar16 = *(undefined4 *)((long)&A->data + lVar19 + lVar12);
              puVar16[1] = *(undefined4 *)((long)&A->data + lVar19 + (uVar14 * 4 + 4) * lVar11);
              puVar16[2] = *(undefined4 *)((long)&A->data + lVar19 + lVar12 + (long)(iVar6 * 2) * 4)
              ;
              puVar16[3] = *(undefined4 *)((long)&A->data + lVar19 + lVar12 + (long)(iVar6 * 3) * 4)
              ;
              puVar16[4] = *(undefined4 *)((long)&A->data + lVar19 + lVar12 + (long)(iVar6 * 4) * 4)
              ;
              puVar16[5] = *(undefined4 *)((long)&A->data + lVar19 + lVar12 + (long)(iVar6 * 5) * 4)
              ;
              puVar16[6] = *(undefined4 *)((long)&A->data + lVar19 + lVar12 + (long)(iVar6 * 6) * 4)
              ;
              puVar16[7] = *(undefined4 *)((long)&A->data + lVar19 + lVar12 + (long)(iVar6 * 7) * 4)
              ;
              puVar16 = puVar16 + 8;
              iVar10 = iVar10 + -1;
              lVar19 = lVar19 + lVar2;
            } while (iVar10 != 0);
          }
          uVar20 = uVar15 + 8;
          lVar19 = uVar15 + 0xf;
          lVar7 = lVar7 + lVar11 * 0x20;
          uVar15 = uVar20;
        } while (lVar19 < lVar18);
      }
      if ((int)((uint)uVar20 | 3) < max_ii) {
        uVar14 = uVar20 & 0xffffffff;
        lVar12 = lVar1 * uVar14;
        uVar15 = uVar14;
        lVar7 = local_120;
        do {
          lVar19 = lVar7;
          iVar10 = max_kk;
          if (0 < max_kk) {
            do {
              *puVar16 = *(undefined4 *)((long)&A->data + lVar19 + lVar12);
              puVar16[1] = *(undefined4 *)((long)&A->data + lVar19 + (uVar14 * 4 + 4) * lVar11);
              puVar16[2] = *(undefined4 *)((long)&A->data + lVar19 + lVar12 + (long)(iVar6 * 2) * 4)
              ;
              puVar16[3] = *(undefined4 *)((long)&A->data + lVar19 + lVar12 + (long)(iVar6 * 3) * 4)
              ;
              puVar16 = puVar16 + 4;
              iVar10 = iVar10 + -1;
              lVar19 = lVar19 + lVar2;
            } while (iVar10 != 0);
          }
          uVar20 = uVar15 + 4;
          lVar19 = uVar15 + 7;
          lVar7 = lVar7 + lVar11 * 0x10;
          uVar15 = uVar20;
        } while (lVar19 < lVar18);
      }
      if ((int)((uint)uVar20 | 1) < max_ii) {
        uVar15 = (ulong)(int)(uint)uVar20;
        ppvVar8 = (void **)((long)&pMVar17->data + (uVar15 * 4 + 4) * lVar11);
        ppvVar13 = (void **)((long)&pMVar17->data + lVar1 * uVar15);
        do {
          if (0 < max_kk) {
            lVar7 = 0;
            iVar10 = max_kk;
            do {
              *puVar16 = *(undefined4 *)((long)ppvVar13 + lVar7);
              puVar16[1] = *(undefined4 *)((long)ppvVar8 + lVar7);
              puVar16 = puVar16 + 2;
              lVar7 = lVar7 + lVar2;
              iVar10 = iVar10 + -1;
            } while (iVar10 != 0);
          }
          uVar20 = uVar15 + 2;
          lVar7 = uVar15 + 3;
          ppvVar8 = ppvVar8 + lVar11;
          ppvVar13 = ppvVar13 + lVar11;
          uVar15 = uVar20;
        } while (lVar7 < lVar18);
      }
      if ((int)uVar20 < max_ii) {
        lVar7 = (long)(int)uVar20;
        ppvVar8 = (void **)((long)&pMVar17->data + lVar1 * lVar7);
        do {
          ppvVar13 = ppvVar8;
          iVar10 = max_kk;
          if (0 < max_kk) {
            do {
              *puVar16 = *(undefined4 *)ppvVar13;
              puVar16 = puVar16 + 1;
              iVar10 = iVar10 + -1;
              ppvVar13 = (void **)((long)ppvVar13 + lVar2);
            } while (iVar10 != 0);
          }
          lVar7 = lVar7 + 1;
          ppvVar8 = (void **)((long)ppvVar8 + lVar1);
        } while (lVar7 != lVar18);
      }
      uVar9 = uVar9 + 1;
      local_120 = local_120 + 4;
      pMVar17 = (Mat *)((long)&pMVar17->data + 4);
    } while (uVar9 != (uint)batch);
  }
  return;
}

Assistant:

static void pack_A_tile(const Mat& A, Mat& AT, int batch, int max_ii, int max_kk)
{
    const int N = max_kk * batch;

    for (int b = 0; b < batch; b++)
    {
        float* pp = AT.row(b);

        int ii = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; ii + 15 < max_ii; ii += 16)
        {
            const float* p0 = (const float*)A + ii * N + b;

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p0[N];
                pp[2] = p0[2 * N];
                pp[3] = p0[3 * N];
                pp[4] = p0[4 * N];
                pp[5] = p0[5 * N];
                pp[6] = p0[6 * N];
                pp[7] = p0[7 * N];
                pp[8] = p0[8 * N];
                pp[9] = p0[9 * N];
                pp[10] = p0[10 * N];
                pp[11] = p0[11 * N];
                pp[12] = p0[12 * N];
                pp[13] = p0[13 * N];
                pp[14] = p0[14 * N];
                pp[15] = p0[15 * N];
                p0 += batch;
                pp += 16;
            }
        }
#endif // __AVX512F__
        for (; ii + 7 < max_ii; ii += 8)
        {
            const float* p0 = (const float*)A + ii * N + b;

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p0[N];
                pp[2] = p0[2 * N];
                pp[3] = p0[3 * N];
                pp[4] = p0[4 * N];
                pp[5] = p0[5 * N];
                pp[6] = p0[6 * N];
                pp[7] = p0[7 * N];
                p0 += batch;
                pp += 8;
            }
        }
#endif // __AVX__
        for (; ii + 3 < max_ii; ii += 4)
        {
            const float* p0 = (const float*)A + ii * N + b;

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p0[N];
                pp[2] = p0[2 * N];
                pp[3] = p0[3 * N];
                p0 += batch;
                pp += 4;
            }
        }
#endif // __SSE2__
        for (; ii + 1 < max_ii; ii += 2)
        {
            const float* p0 = (const float*)A + ii * N + b;

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p0[N];
                p0 += batch;
                pp += 2;
            }
        }
        for (; ii < max_ii; ii++)
        {
            const float* p0 = (const float*)A + ii * N + b;

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                p0 += batch;
                pp += 1;
            }
        }
    }
}